

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

float ****
gauden_param_read(char *file_name,int32 *out_n_mgau,int32 *out_n_feat,int32 *out_n_density,
                 int32 **out_veclen)

{
  int iVar1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  int32 *buf;
  float ****inptr;
  void *buf_00;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  char **ppcVar12;
  int32 n_feat;
  int32 byteswap;
  uint32 chksum;
  int32 n_density;
  int32 n_mgau;
  int32 n;
  char *local_78;
  char tmp;
  char **argval;
  char **argname;
  int32 *local_58;
  int32 *local_50;
  int32 **local_48;
  FILE *local_40;
  int32 *local_38;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,0x80,"Reading mixture gaussian parameter: %s\n",file_name);
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                   ,0x83,"Failed to open file \'%s\' for reading",file_name);
    return (float ****)0x0;
  }
  iVar3 = bio_readhdr((FILE *)__stream,&argname,&argval,&byteswap);
  if (iVar3 < 0) {
    pcVar8 = "Failed to read header from file \'%s\'\n";
    lVar11 = 0x89;
  }
  else {
    pcVar8 = *argname;
    local_50 = out_n_density;
    local_48 = out_veclen;
    local_38 = out_n_mgau;
    if (pcVar8 == (char *)0x0) {
      bVar2 = true;
    }
    else {
      lVar11 = 0;
      bVar2 = false;
      ppcVar12 = argname;
      local_78 = file_name;
      local_58 = out_n_feat;
      local_40 = __stream;
      do {
        iVar4 = strcmp(pcVar8,"version");
        if (iVar4 == 0) {
          pcVar8 = *(char **)((long)argval + lVar11);
          iVar4 = strcmp(pcVar8,"1.0");
          if (iVar4 != 0) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0x94,"Version mismatch(%s): %s, expecting %s\n",local_78,pcVar8,"1.0");
            ppcVar12 = argname;
          }
        }
        else {
          iVar4 = strcmp(pcVar8,"chksum0");
          if (iVar4 == 0) {
            bVar2 = true;
          }
        }
        pcVar8 = *(char **)((long)ppcVar12 + lVar11 + 8);
        lVar11 = lVar11 + 8;
      } while (pcVar8 != (char *)0x0);
      bVar2 = !bVar2;
      file_name = local_78;
      out_n_feat = local_58;
      __stream = local_40;
      argname = ppcVar12;
    }
    bio_hdrarg_free(argname,argval);
    argval = (char **)0x0;
    argname = (char **)0x0;
    chksum = 0;
    iVar3 = bio_fread(&n_mgau,4,1,(FILE *)__stream,byteswap,&chksum);
    if (iVar3 == 1) {
      *local_38 = n_mgau;
      iVar3 = bio_fread(&n_feat,4,1,(FILE *)__stream,byteswap,&chksum);
      if (iVar3 == 1) {
        *out_n_feat = n_feat;
        iVar3 = bio_fread(&n_density,4,1,(FILE *)__stream,byteswap,&chksum);
        if (iVar3 != 1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0xb1,"fread(%s) (#density/codebook) failed\n",file_name);
        }
        *local_50 = n_density;
        local_78 = file_name;
        buf = (int32 *)__ckd_calloc__((long)n_feat,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                      ,0xb6);
        *local_48 = buf;
        uVar5 = bio_fread(buf,4,n_feat,(FILE *)__stream,byteswap,&chksum);
        if (uVar5 == n_feat) {
          if ((int)uVar5 < 1) {
            uVar9 = 0;
          }
          else {
            uVar7 = 0;
            uVar9 = 0;
            do {
              uVar9 = (ulong)(uint)((int)uVar9 + buf[uVar7]);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          iVar3 = bio_fread(&n,4,1,(FILE *)__stream,byteswap,&chksum);
          if (iVar3 == 1) {
            if (n == n_density * n_mgau * (int)uVar9) {
              inptr = (float ****)
                      __ckd_calloc_3d__((long)n_mgau,(long)n_feat,(long)n_density,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                        ,0xd4);
              buf_00 = __ckd_calloc__((long)n,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                      ,0xd5);
              if (0 < (long)n_mgau) {
                lVar11 = 0;
                iVar4 = 0;
                do {
                  if (0 < n_feat) {
                    uVar9 = 0;
                    do {
                      if (0 < n_density) {
                        iVar1 = buf[uVar9];
                        pfVar10 = (float *)((long)buf_00 + (long)iVar4 * 4);
                        iVar4 = iVar4 + iVar1 * n_density;
                        uVar7 = 0;
                        do {
                          inptr[lVar11][uVar9][uVar7] = pfVar10;
                          uVar7 = uVar7 + 1;
                          pfVar10 = pfVar10 + iVar1;
                        } while ((uint)n_density != uVar7);
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar9 != (uint)n_feat);
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != n_mgau);
              }
              iVar3 = bio_fread(buf_00,4,n,(FILE *)__stream,byteswap,&chksum);
              if (iVar3 == n) {
                if (!bVar2) {
                  bio_verify_chksum((FILE *)__stream,byteswap,chksum);
                }
                sVar6 = fread(&tmp,1,1,__stream);
                if (sVar6 != 1) {
                  fclose(__stream);
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                          ,0xf3,"%d codebook, %d feature, size: \n",(ulong)(uint)n_mgau,
                          (ulong)(uint)n_feat);
                  if (n_feat < 1) {
                    return inptr;
                  }
                  lVar11 = 0;
                  do {
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                            ,0xf5," %dx%d\n",(ulong)(uint)n_density,(ulong)(uint)buf[lVar11]);
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < n_feat);
                  return inptr;
                }
                pcVar8 = "More data than expected in %s\n";
                lVar11 = 0xeb;
              }
              else {
                pcVar8 = "Failed to read density data from file \'%s\'\n";
                lVar11 = 0xe1;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                      ,lVar11,pcVar8,local_78);
              fclose(__stream);
              ckd_free_3d(inptr);
              return (float ****)0x0;
            }
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                    ,0xcd,"Number of parameters in %s(%d) doesn\'t match dimensions: %d x %d x %d\n"
                    ,local_78,(ulong)(uint)n,(long)n_mgau,(long)n_density,uVar9);
            goto LAB_0014f8b2;
          }
          pcVar8 = "Failed to read number of parameters from %s\n";
          lVar11 = 0xc5;
          file_name = local_78;
        }
        else {
          pcVar8 = "fread(%s) (feature-lengths) failed\n";
          lVar11 = 0xba;
          file_name = local_78;
        }
      }
      else {
        pcVar8 = "Failed to read number of features from %s\n";
        lVar11 = 0xa9;
      }
    }
    else {
      pcVar8 = "Failed to read number of codebooks from %s\n";
      lVar11 = 0xa1;
    }
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,lVar11,pcVar8,file_name);
LAB_0014f8b2:
  fclose(__stream);
  return (float ****)0x0;
}

Assistant:

static float ****
gauden_param_read(const char *file_name,
                  int32 * out_n_mgau,
                  int32 * out_n_feat,
                  int32 * out_n_density,
                  int32 ** out_veclen)
{
    char tmp;
    FILE *fp;
    int32 i, j, k, l, n, blk;
    int32 n_mgau;
    int32 n_feat;
    int32 n_density;
    int32 *veclen;
    int32 byteswap, chksum_present;
    float32 ****out;
    float32 *buf;
    char **argname, **argval;
    uint32 chksum;

    E_INFO("Reading mixture gaussian parameter: %s\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file_name);
        return NULL;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read header from file '%s'\n", file_name);
        fclose(fp);
        return NULL;
    }

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], GAUDEN_PARAM_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], GAUDEN_PARAM_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* #Codebooks */
    if (bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of codebooks from %s\n", file_name);
        fclose(fp);
        return NULL;
    }
    *out_n_mgau = n_mgau;

    /* #Features/codebook */
    if (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of features from %s\n", file_name);
        fclose(fp);
        return NULL;
    }
    *out_n_feat = n_feat;

    /* #Gaussian densities/feature in each codebook */
    if (bio_fread(&n_density, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("fread(%s) (#density/codebook) failed\n", file_name);
    }
    *out_n_density = n_density;

    /* #Dimensions in each feature stream */
    veclen = ckd_calloc(n_feat, sizeof(uint32));
    *out_veclen = veclen;
    if (bio_fread(veclen, sizeof(int32), n_feat, fp, byteswap, &chksum) !=
        n_feat) {
        E_ERROR("fread(%s) (feature-lengths) failed\n", file_name);
        fclose(fp);
        return NULL;
    }

    /* blk = total vector length of all feature streams */
    for (i = 0, blk = 0; i < n_feat; i++)
        blk += veclen[i];

    /* #Floats to follow; for the ENTIRE SET of CODEBOOKS */
    if (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read number of parameters from %s\n", file_name);
        fclose(fp);
        return NULL;
    }

    if (n != n_mgau * n_density * blk) {
        E_ERROR
            ("Number of parameters in %s(%d) doesn't match dimensions: %d x %d x %d\n",
             file_name, n, n_mgau, n_density, blk);
        fclose(fp);
        return NULL;
    }

    /* Allocate memory for mixture gaussian densities if not already allocated */
    out = (float32 ****) ckd_calloc_3d(n_mgau, n_feat, n_density,
                                      sizeof(float32 *));
    buf = (float32 *) ckd_calloc(n, sizeof(float32));
    for (i = 0, l = 0; i < n_mgau; i++) {
        for (j = 0; j < n_feat; j++) {
            for (k = 0; k < n_density; k++) {
                out[i][j][k] = &buf[l];
                l += veclen[j];
            }
        }
    }

    /* Read mixture gaussian densities data */
    if (bio_fread(buf, sizeof(float32), n, fp, byteswap, &chksum) != n) {
        E_ERROR("Failed to read density data from file '%s'\n", file_name);
        fclose(fp);
        ckd_free_3d(out);
        return NULL;
    }

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&tmp, 1, 1, fp) == 1) {
        E_ERROR("More data than expected in %s\n", file_name);
        fclose(fp);
        ckd_free_3d(out);
        return NULL;
    }

    fclose(fp);

    E_INFO("%d codebook, %d feature, size: \n", n_mgau, n_feat);
    for (i = 0; i < n_feat; i++)
        E_INFO(" %dx%d\n", n_density, veclen[i]);

    return out;
}